

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall
mocker::detail::InterferenceGraph::clearAndInit
          (InterferenceGraph *this,
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          *nonPrecolored)

{
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  bool bVar1;
  reference __k;
  mapped_type *this_00;
  shared_ptr<mocker::nasm::Register> *psVar2;
  reference __k_00;
  size_type sVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  shared_ptr<mocker::nasm::Register> *local_2c0;
  shared_ptr<mocker::nasm::Register> *n_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range2_1;
  shared_ptr<mocker::nasm::Register> *local_178;
  undefined1 local_170 [32];
  shared_ptr<mocker::nasm::Register> local_150;
  shared_ptr<mocker::nasm::Register> local_140;
  shared_ptr<mocker::nasm::Register> local_130;
  shared_ptr<mocker::nasm::Register> local_120;
  shared_ptr<mocker::nasm::Register> local_110;
  shared_ptr<mocker::nasm::Register> local_100;
  shared_ptr<mocker::nasm::Register> local_f0;
  shared_ptr<mocker::nasm::Register> local_e0;
  shared_ptr<mocker::nasm::Register> local_d0;
  shared_ptr<mocker::nasm::Register> local_c0;
  shared_ptr<mocker::nasm::Register> local_b0;
  shared_ptr<mocker::nasm::Register> local_a0;
  shared_ptr<mocker::nasm::Register> local_90;
  shared_ptr<mocker::nasm::Register> local_80;
  shared_ptr<mocker::nasm::Register> local_70;
  undefined1 local_60 [8];
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  machineRegs;
  shared_ptr<mocker::nasm::Register> *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range2;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *nonPrecolored_local;
  InterferenceGraph *this_local;
  
  std::
  unordered_set<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_mocker::detail::InterferenceGraph::NodePairHash,_mocker::detail::InterferenceGraph::NodePairEqual,_std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
  ::clear(&this->edges);
  std::
  unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
  ::clear(&this->originalAdjList);
  std::
  unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
  ::clear(&this->curDegree);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::clear(&this->simplifiable);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::clear(&this->highDegree);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::clear(&this->freeze);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::clear(&this->coalesced);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::clear(&this->removed);
  std::
  unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
  ::clear(&this->alias);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::clear(&this->selectStack);
  __end2 = std::
           vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::begin(nonPrecolored);
  n = (shared_ptr<mocker::nasm::Register> *)
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::end(nonPrecolored);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                *)&n);
    if (!bVar1) break;
    __k = __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
          ::operator*(&__end2);
    std::initializer_list<std::shared_ptr<mocker::nasm::Register>_>::initializer_list
              ((initializer_list<std::shared_ptr<mocker::nasm::Register>_> *)
               &machineRegs.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = std::
              unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
              ::operator[](&this->originalAdjList,__k);
    std::
    unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::operator=(this_00,stack0xffffffffffffffb8);
    pmVar4 = std::
             unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
             ::operator[](&this->curDegree,__k);
    *pmVar4 = 0;
    pmVar5 = std::
             unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
             ::operator[](&this->alias,__k);
    std::shared_ptr<mocker::nasm::Register>::operator=(pmVar5,__k);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
    ::operator++(&__end2);
  }
  local_178 = (shared_ptr<mocker::nasm::Register> *)local_170;
  psVar2 = nasm::rax();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr
            ((shared_ptr<mocker::nasm::Register> *)local_170,psVar2);
  local_178 = (shared_ptr<mocker::nasm::Register> *)(local_170 + 0x10);
  psVar2 = nasm::rcx();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr
            ((shared_ptr<mocker::nasm::Register> *)(local_170 + 0x10),psVar2);
  local_178 = &local_150;
  psVar2 = nasm::rdx();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_150,psVar2);
  local_178 = &local_140;
  psVar2 = nasm::rbx();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_140,psVar2);
  local_178 = &local_130;
  psVar2 = nasm::rsp();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_130,psVar2);
  local_178 = &local_120;
  psVar2 = nasm::rbp();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_120,psVar2);
  local_178 = &local_110;
  psVar2 = nasm::rsi();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_110,psVar2);
  local_178 = &local_100;
  psVar2 = nasm::rdi();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_100,psVar2);
  local_178 = &local_f0;
  psVar2 = nasm::r8();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_f0,psVar2);
  local_178 = &local_e0;
  psVar2 = nasm::r9();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_e0,psVar2);
  local_178 = &local_d0;
  psVar2 = nasm::r10();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_d0,psVar2);
  local_178 = &local_c0;
  psVar2 = nasm::r11();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_c0,psVar2);
  local_178 = &local_b0;
  psVar2 = nasm::r12();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_b0,psVar2);
  local_178 = &local_a0;
  psVar2 = nasm::r13();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_a0,psVar2);
  local_178 = &local_90;
  psVar2 = nasm::r14();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_90,psVar2);
  local_178 = &local_80;
  psVar2 = nasm::r15();
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_80,psVar2);
  local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_170;
  local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x10;
  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator
            ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&__range2_1 + 3));
  __l._M_len = (size_type)
               local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_70.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            *)local_60,__l,
           (allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&__range2_1 + 3));
  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
            ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&__range2_1 + 3));
  local_2c0 = &local_70;
  do {
    local_2c0 = local_2c0 + -1;
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_2c0);
  } while (local_2c0 != (shared_ptr<mocker::nasm::Register> *)local_170);
  __end2_1 = std::
             vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)local_60);
  n_1 = (shared_ptr<mocker::nasm::Register> *)
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               *)local_60);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                        *)&n_1);
    if (!bVar1) break;
    __k_00 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
             ::operator*(&__end2_1);
    sVar3 = std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::size(nonPrecolored);
    pmVar4 = std::
             unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
             ::operator[](&this->curDegree,__k_00);
    *pmVar4 = sVar3 + 0x1e;
    pmVar5 = std::
             unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
             ::operator[](&this->alias,__k_00);
    std::shared_ptr<mocker::nasm::Register>::operator=(pmVar5,__k_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)local_60);
  return;
}

Assistant:

void InterferenceGraph::clearAndInit(const std::vector<Node> &nonPrecolored) {
  edges.clear();
  originalAdjList.clear();
  curDegree.clear();
  simplifiable.clear();
  highDegree.clear();
  freeze.clear();
  coalesced.clear();
  removed.clear();
  alias.clear();
  selectStack.clear();

  for (auto &n : nonPrecolored) {
    originalAdjList[n] = {};
    curDegree[n] = 0;
    alias[n] = n;
  }
  std::vector<Node> machineRegs = {
      nasm::rax(), nasm::rcx(), nasm::rdx(), nasm::rbx(),
      nasm::rsp(), nasm::rbp(), nasm::rsi(), nasm::rdi(),
      nasm::r8(),  nasm::r9(),  nasm::r10(), nasm::r11(),
      nasm::r12(), nasm::r13(), nasm::r14(), nasm::r15()};
  for (auto &n : machineRegs) {
    curDegree[n] = nonPrecolored.size() + 30;
    alias[n] = n;
  }
}